

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlChar * xmlXPathCastNumberToString(double val)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  xmlChar *pxVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  double dVar12;
  char work [30];
  char cStack_79;
  char buf [100];
  
  iVar10 = ((0.0 < val) - 1) + (uint)(0.0 < val);
  if (ABS(val) != INFINITY) {
    iVar10 = 0;
  }
  if (iVar10 == -1) {
    pxVar5 = xmlStrdup((xmlChar *)"-Infinity");
    return pxVar5;
  }
  if (iVar10 == 1) {
    pxVar5 = xmlStrdup("Infinity");
    return pxVar5;
  }
  if (NAN(val)) {
    pxVar5 = xmlStrdup((xmlChar *)"NaN");
    return pxVar5;
  }
  if ((val == 0.0) && (!NAN(val))) {
    pxVar5 = xmlStrdup("0");
    return pxVar5;
  }
  if (ABS(val) != INFINITY || val <= 0.0) {
    if ((-2147483648.0 < val) && (val < 2147483647.0)) {
      if (((double)(int)val == val) && (!NAN((double)(int)val) && !NAN(val))) {
        if ((int)val == 0) {
          pcVar9 = buf + 1;
          buf[0] = '0';
        }
        else {
          snprintf(work,0x1d,"%d");
          for (lVar11 = 0; (cVar1 = work[lVar11], cVar1 != '\0' && (lVar11 < 99));
              lVar11 = lVar11 + 1) {
            buf[lVar11] = cVar1;
          }
          pcVar9 = buf + (lVar11 - (ulong)(0x62 < lVar11));
        }
        *pcVar9 = '\0';
        goto LAB_001d506d;
      }
    }
    dVar12 = ABS(val);
    if ((1000000000.0 < dVar12) || (dVar12 < 1e-05)) {
      uVar3 = snprintf(work,0x1c,"%*.*e",val,0x15,0xe);
      uVar4 = (int)uVar3 >> 0x1f & uVar3;
      for (; (uVar2 = uVar4, 0 < (int)uVar3 && (uVar2 = uVar3, work[uVar3] != 'e'));
          uVar3 = uVar3 - 1) {
      }
    }
    else {
      dVar12 = log10(dVar12);
      uVar2 = snprintf(work,0x1c,"%0.*f",val,(ulong)((0 < (int)dVar12 ^ 0xf) - (int)dVar12));
    }
    while (pcVar9 = work, work[0] == ' ') {
      do {
        cVar1 = pcVar9[1];
        *pcVar9 = cVar1;
        pcVar9 = pcVar9 + 1;
      } while (cVar1 != '\0');
      uVar2 = uVar2 - 1;
    }
    pcVar6 = work + (int)uVar2;
    pcVar9 = pcVar6;
    do {
      pcVar8 = pcVar9;
      pcVar9 = pcVar8 + -1;
    } while (pcVar8[-1] == '0');
    if (pcVar8[-1] != '.') {
      pcVar9 = pcVar8;
    }
    do {
      cVar1 = *pcVar6;
      pcVar6 = pcVar6 + 1;
      *pcVar9 = cVar1;
      pcVar9 = pcVar9 + 1;
    } while (cVar1 != '\0');
    sVar7 = strlen(work);
    iVar10 = (int)sVar7 + 1;
    if (99 < iVar10) {
      buf[0x32] = '\0';
      iVar10 = 99;
    }
    memcpy(buf,work,(long)iVar10);
  }
  else {
    builtin_strncpy(buf,"Infinity",9);
  }
LAB_001d506d:
  buf[99] = '\0';
  pxVar5 = xmlStrdup((xmlChar *)buf);
  return pxVar5;
}

Assistant:

xmlChar *
xmlXPathCastNumberToString (double val) {
    xmlChar *ret;
    switch (xmlXPathIsInf(val)) {
    case 1:
	ret = xmlStrdup((const xmlChar *) "Infinity");
	break;
    case -1:
	ret = xmlStrdup((const xmlChar *) "-Infinity");
	break;
    default:
	if (xmlXPathIsNaN(val)) {
	    ret = xmlStrdup((const xmlChar *) "NaN");
	} else if (val == 0) {
            /* Omit sign for negative zero. */
	    ret = xmlStrdup((const xmlChar *) "0");
	} else {
	    /* could be improved */
	    char buf[100];
	    xmlXPathFormatNumber(val, buf, 99);
	    buf[99] = 0;
	    ret = xmlStrdup((const xmlChar *) buf);
	}
    }
    return(ret);
}